

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

void Aig_ManChoiceConstructiveOne(Aig_Man_t *pNew,Aig_Man_t *pPrev,Aig_Man_t *pThis)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  long lVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  
  if (pNew->nObjs[2] != pPrev->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5ca,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[2] != pThis->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cb,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] != pPrev->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cc,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] != pThis->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cd,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  pVVar7 = pNew->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pVVar7->pArray[lVar6] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar6] + 0x18);
        *pbVar1 = *pbVar1 | 0x20;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNew->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  lVar6 = (long)pPrev->vObjs->nSize;
  if (0 < lVar6) {
    lVar9 = 0;
    do {
      pvVar4 = pPrev->vObjs->pArray[lVar9];
      if ((pvVar4 != (void *)0x0) &&
         ((*(byte *)((*(ulong *)((long)pvVar4 + 0x28) & 0xfffffffffffffffe) + 0x18) & 0x20) == 0)) {
        __assert_fail("Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5d2,
                      "void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  pVVar7 = pNew->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pVVar7->pArray[lVar6] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar6] + 0x18);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNew->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pPrev->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pVVar7->pArray[lVar6] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar6] + 0x18);
        *pbVar1 = *pbVar1 | 0x20;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pPrev->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pPrev->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pVVar7->pArray[lVar6] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar6] + 0x18);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pPrev->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  pThis->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pVVar7 = pThis->vCis;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pNew->vCis->nSize <= lVar6) goto LAB_00636306;
      *(void **)((long)pVVar7->pArray[lVar6] + 0x28) = pNew->vCis->pArray[lVar6];
      lVar6 = lVar6 + 1;
      pVVar7 = pThis->vCis;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pThis->vCos;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pNew->vCos->nSize <= lVar6) goto LAB_00636306;
      *(void **)((long)pVVar7->pArray[lVar6] + 0x28) = pNew->vCos->pArray[lVar6];
      lVar6 = lVar6 + 1;
      pVVar7 = pThis->vCos;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pThis->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      pvVar4 = pVVar7->pArray[lVar6];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar4 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar8 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar11 = Aig_And(pNew,pAVar11,pAVar10);
        *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar11;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pThis->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pThis->vCos;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pNew->vCos->nSize <= lVar6) {
LAB_00636306:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (pNew->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5ac,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar11 = (Aig_Obj_t *)(*(ulong *)((long)pNew->vCos->pArray[lVar6] + 8) & 0xfffffffffffffffe);
      iVar2 = pAVar11->Id;
      if (pNew->nReprsAlloc <= iVar2) {
        __assert_fail("pNode1->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5af,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar10 = (Aig_Obj_t *)
                (*(ulong *)((*(ulong *)((long)pVVar7->pArray[lVar6] + 8) & 0xfffffffffffffffe) +
                           0x28) & 0xfffffffffffffffe);
      iVar3 = pAVar10->Id;
      if (pNew->nReprsAlloc <= iVar3) {
        __assert_fail("pNode2->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5b0,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (pAVar11 != pAVar10) {
        iVar5 = iVar3;
        if (iVar3 < iVar2) {
          iVar5 = iVar2;
        }
        if (iVar2 < iVar3) {
          pAVar10 = pAVar11;
        }
        pNew->pReprs[iVar5] = pAVar10;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pThis->vCos;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Aig_ManChoiceConstructiveOne( Aig_Man_t * pNew, Aig_Man_t * pPrev, Aig_Man_t * pThis )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev) );
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis) );
    // make sure the nodes of pPrev point to pNew
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        assert( Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB );
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 0;
    // make sure the nodes of pThis point to pPrev
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 0;
    // remap nodes of pThis on top of pNew using pPrev
    pObj = Aig_ManConst1(pThis);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( pThis, pObj, i )
        pObj->pData = Aig_ManCi(pNew, i);
    Aig_ManForEachCo( pThis, pObj, i )
        pObj->pData = Aig_ManCo(pNew, i);
    // go through the nodes in the topological order
    Aig_ManForEachNode( pThis, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // set the inputs of POs as equivalent
    Aig_ManForEachCo( pThis, pObj, i )
    {
        pObjNew = Aig_ObjFanin0( Aig_ManCo(pNew,i) );
        // pObjNew and Aig_ObjFanin0(pObj)->pData are equivalent
        Aig_ObjSetRepr_( pNew, pObjNew, Aig_Regular((Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData) );
    }
}